

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  ThreadSafeArena *this_00;
  Extension *pEVar1;
  char *failure_msg;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_01;
  int line;
  ThreadSafeArena *pTVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  anon_enum_32 local_44;
  LogMessageFatal local_40;
  
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
    return;
  }
  this_00 = &this->arena_->impl_;
  pTVar2 = (ThreadSafeArena *)(message->_internal_metadata_).ptr_;
  if (((ulong)pTVar2 & 1) != 0) {
    pTVar2 = *(ThreadSafeArena **)((ulong)pTVar2 & 0xfffffffffffffffe);
  }
  if (pTVar2 != this_00 && pTVar2 != (ThreadSafeArena *)0x0) {
    failure_msg = "message_arena == nullptr || message_arena == arena";
    line = 700;
    goto LAB_001a4c63;
  }
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar1->type = type;
    local_40.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(type);
    local_44 = 10;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            ((CppType *)&local_40,&local_44,
                             "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      line = 0x2c1;
      goto LAB_001a4c63;
    }
    pEVar1->is_repeated = false;
    pEVar1->field_0xa = (pEVar1->field_0xa & 0xfa) + 1;
LAB_001a4bd7:
    if (pTVar2 == this_00) {
      pEVar1->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
    }
    else if (pTVar2 == (ThreadSafeArena *)0x0) {
      pEVar1->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
      ThreadSafeArena::AddCleanup
                (this_00,message,arena_delete_object<google::protobuf::MessageLite>);
    }
    else {
      this_01 = (anon_union_8_9_fdc4a54a_for_Extension_0)MessageLite::New(message,(Arena *)this_00);
      pEVar1->field_0 = this_01;
      MessageLite::CheckTypeAndMergeFrom((MessageLite *)this_01,message);
    }
LAB_001a4c27:
    pEVar1->field_0xa = pEVar1->field_0xa & 0xfd;
    return;
  }
  local_40.super_LogMessage.errno_saver_.saved_errno_ = pEVar1->is_repeated ^ CPPTYPE_INT32;
  local_44 = OPTIONAL_FIELD;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                          ((anon_enum_32 *)&local_40,&local_44,
                           "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                          );
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_40.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(pEVar1->type);
    local_44 = 10;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            ((CppType *)&local_40,&local_44,
                             "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      if ((pEVar1->field_0xa & 4) != 0) {
        (**(code **)(**(long **)&(pEVar1->field_0).int32_t_value + 0x30))
                  (*(long **)&(pEVar1->field_0).int32_t_value,message,this_00);
        goto LAB_001a4c27;
      }
      if ((this_00 == (ThreadSafeArena *)0x0) &&
         ((long *)(pEVar1->field_0).int64_t_value != (long *)0x0)) {
        (**(code **)(*(long *)(pEVar1->field_0).int64_t_value + 8))();
      }
      goto LAB_001a4bd7;
    }
  }
  line = 0x2cf;
LAB_001a4c63:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Arena* const arena = arena_;
  Arena* const message_arena = message->GetArena();
  ABSL_DCHECK(message_arena == nullptr || message_arena == arena);

  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    if (message_arena == arena) {
      extension->ptr.message_value = message;
    } else if (message_arena == nullptr) {
      extension->ptr.message_value = message;
      arena->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->ptr.message_value = message->New(arena);
      extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->SetAllocatedMessage(message, arena);
    } else {
      if (arena == nullptr) {
        delete extension->ptr.message_value;
      }
      if (message_arena == arena) {
        extension->ptr.message_value = message;
      } else if (message_arena == nullptr) {
        extension->ptr.message_value = message;
        arena->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->ptr.message_value = message->New(arena);
        extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}